

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O1

bool absl::lts_20250127::time_internal::cctz::anon_unknown_10::make_time
               (civil_second *cs,int is_dst,time_t *t,tm *tm)

{
  time_t tVar1;
  tm *ptVar2;
  tm tm2;
  tm tStack_48;
  
  tm->tm_year = (int)(cs->f_).y + -0x76c;
  tm->tm_mon = (cs->f_).m + -1;
  tm->tm_mday = (int)(cs->f_).d;
  tm->tm_hour = (int)(cs->f_).hh;
  tm->tm_min = (int)(cs->f_).mm;
  tm->tm_sec = (int)(cs->f_).ss;
  tm->tm_isdst = is_dst;
  tVar1 = mktime((tm *)tm);
  *t = tVar1;
  if ((tVar1 == -1) &&
     ((((ptVar2 = localtime_r(t,&tStack_48), ptVar2 == (tm *)0x0 || (ptVar2->tm_year != tm->tm_year)
        ) || (ptVar2->tm_mon != tm->tm_mon)) ||
      (((ptVar2->tm_mday != tm->tm_mday || (ptVar2->tm_hour != tm->tm_hour)) ||
       ((ptVar2->tm_min != tm->tm_min || (ptVar2->tm_sec != tm->tm_sec)))))))) {
    return false;
  }
  return true;
}

Assistant:

bool make_time(const civil_second& cs, int is_dst, std::time_t* t,
               std::tm* tm) {
  tm->tm_year = static_cast<int>(cs.year() - year_t{1900});
  tm->tm_mon = cs.month() - 1;
  tm->tm_mday = cs.day();
  tm->tm_hour = cs.hour();
  tm->tm_min = cs.minute();
  tm->tm_sec = cs.second();
  tm->tm_isdst = is_dst;
  *t = std::mktime(tm);
  if (*t == std::time_t{-1}) {
    std::tm tm2;
    const std::tm* tmp = local_time(t, &tm2);
    if (tmp == nullptr || tmp->tm_year != tm->tm_year ||
        tmp->tm_mon != tm->tm_mon || tmp->tm_mday != tm->tm_mday ||
        tmp->tm_hour != tm->tm_hour || tmp->tm_min != tm->tm_min ||
        tmp->tm_sec != tm->tm_sec) {
      // A true error (not just one second before the epoch).
      return false;
    }
  }
  return true;
}